

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O2

int Sbm_ManCheckSol(Sbm_Man_t *p,Vec_Int_t *vSol)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  char *__format;
  int iVar9;
  int local_40;
  
  p->vPolar->nSize = 0;
  pVVar6 = p->vLit2Used;
  uVar8 = p->nInputs + p->vObjCuts->nSize;
  Vec_IntGrow(pVVar6,uVar8);
  uVar5 = 0;
  uVar7 = 0;
  if (0 < (int)uVar8) {
    uVar7 = (ulong)uVar8;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    pVVar6->pArray[uVar5] = 0;
  }
  pVVar6->nSize = uVar8;
  iVar9 = 0;
  local_40 = 1;
  do {
    if (p->vSolCuts->nSize <= iVar9) {
      for (iVar9 = 0; iVar9 < p->vRoots->nSize; iVar9 = iVar9 + 1) {
        uVar8 = Vec_IntEntry(p->vRoots,iVar9);
        iVar1 = Vec_IntEntry(p->vLit2Used,uVar8);
        if (iVar1 == 0) {
          local_40 = 0;
          printf("Output literal %d has no cut.\n",(ulong)uVar8);
        }
      }
      iVar9 = 0;
      do {
        if (p->vSolCuts->nSize <= iVar9) {
          return local_40;
        }
        uVar8 = Vec_IntEntry(p->vSolCuts,iVar9);
        if (-1 < (int)uVar8) {
          pVVar6 = Vec_WecEntry(p->vCuts,uVar8);
          for (iVar1 = 1; iVar1 < pVVar6->nSize; iVar1 = iVar1 + 1) {
            uVar3 = Vec_IntEntry(pVVar6,iVar1);
            iVar2 = uVar3 - p->LitShift;
            if (iVar2 < 0) {
              if ((int)uVar3 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              if ((uVar3 & 1) == 0) {
                __assert_fail("Abc_LitIsCompl(Lit)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaSatMap.c"
                              ,0x7e,"int Sbm_ManCheckSol(Sbm_Man_t *, Vec_Int_t *)");
              }
              p_00 = p->vLit2Used;
              iVar2 = p->vObjCuts->nSize;
              iVar4 = Abc_Lit2Var(uVar3);
              iVar2 = Vec_IntEntry(p_00,iVar4 + iVar2 + -1);
              if (iVar2 == 0) {
                iVar2 = Abc_Lit2Var(uVar3);
                uVar3 = iVar2 - 1;
                __format = "Inverter of input %d of cut %d is not mapped.\n";
                goto LAB_005f4a7e;
              }
            }
            else {
              iVar2 = Vec_IntEntry(p->vLit2Used,iVar2);
              if (iVar2 == 0) {
                uVar3 = uVar3 - p->LitShift;
                __format = "Internal literal %d of cut %d is not mapped.\n";
LAB_005f4a7e:
                local_40 = 0;
                printf(__format,(ulong)uVar3,(ulong)uVar8);
              }
            }
          }
          Vec_IntPush(p->vPolar,uVar8 + p->FirstVar);
        }
        iVar9 = iVar9 + 1;
      } while( true );
    }
    iVar1 = Vec_IntEntry(p->vSolCuts,iVar9);
    if (iVar1 < 0) {
      pVVar6 = p->vLit2Used;
      iVar1 = -iVar1;
LAB_005f4933:
      Vec_IntWriteEntry(pVVar6,iVar1,1);
      Vec_IntPush(p->vPolar,iVar1);
    }
    else {
      Vec_IntPush(p->vPolar,p->FirstVar + iVar1);
      pVVar6 = Vec_WecEntry(p->vCuts,iVar1);
      iVar1 = Vec_IntEntry(pVVar6,0);
      iVar1 = iVar1 - p->LitShift;
      iVar2 = Vec_IntEntry(p->vLit2Used,iVar1);
      if (iVar2 == 0) {
        pVVar6 = p->vLit2Used;
        goto LAB_005f4933;
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

int Sbm_ManCheckSol( Sbm_Man_t * p, Vec_Int_t * vSol )
{
    //int K = Vec_IntSize(vSol) - 1;
    int i, j, Lit, Cut;
    int RetValue = 1;
    Vec_Int_t * vCut;
    // clear polarity and assumptions
    Vec_IntClear( p->vPolar );
    // mark used literals
    Vec_IntFill( p->vLit2Used, Vec_WecSize(p->vObjCuts) + p->nInputs, 0 );
    Vec_IntForEachEntry( p->vSolCuts, Cut, i )
    {
        if ( Cut < 0 ) // input inverter variable
        {
            Vec_IntWriteEntry( p->vLit2Used, -Cut, 1 );
            Vec_IntPush( p->vPolar, -Cut ); 
            continue;
        }
        Vec_IntPush( p->vPolar, p->FirstVar + Cut ); 
        vCut = Vec_WecEntry( p->vCuts, Cut );
        Lit = Vec_IntEntry( vCut, 0 ) - p->LitShift; // obj literal
        if ( Vec_IntEntry(p->vLit2Used, Lit) )
            continue;
        Vec_IntWriteEntry( p->vLit2Used, Lit, 1 );
        Vec_IntPush( p->vPolar, Lit ); // literal variable
    }
    // check that the output literals are used
    Vec_IntForEachEntry( p->vRoots, Lit, i )
    {
        if ( Vec_IntEntry(p->vLit2Used, Lit) == 0 )
            printf( "Output literal %d has no cut.\n", Lit ), RetValue = 0;
    }
    // check internal nodes
    Vec_IntForEachEntry( p->vSolCuts, Cut, i )
    {
        if ( Cut < 0 )
            continue;
        vCut = Vec_WecEntry( p->vCuts, Cut );
        Vec_IntForEachEntryStart( vCut, Lit, j, 1 )
            if ( Lit - p->LitShift < 0 )
            {
                assert( Abc_LitIsCompl(Lit) );
                if ( Vec_IntEntry(p->vLit2Used, Vec_WecSize(p->vObjCuts) + Abc_Lit2Var(Lit)-1) == 0 )
                    printf( "Inverter of input %d of cut %d is not mapped.\n", Abc_Lit2Var(Lit)-1, Cut ), RetValue = 0;
            }
            else if ( Vec_IntEntry(p->vLit2Used, Lit - p->LitShift) == 0 )
                printf( "Internal literal %d of cut %d is not mapped.\n", Lit - p->LitShift, Cut ), RetValue = 0;
        // create polarity
        Vec_IntPush( p->vPolar, p->FirstVar + Cut ); // cut variable
    }
    return RetValue;
}